

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Scanner.cpp
# Opt level: O1

void __thiscall Refal2::CScanner::normalizeLineFeed(CScanner *this,char c)

{
  int iVar1;
  uint uVar2;
  
  if (c == '\r') {
LAB_00130c50:
    preprocessing(this,'\n');
    this->line = this->line + 1;
    this->position = 1;
  }
  else {
    uVar2 = (uint)c;
    if (uVar2 != 0x7f) {
      if (uVar2 == 10) {
        if (this->afterCarriageReturn != false) goto LAB_00130ce7;
        goto LAB_00130c50;
      }
      if ((0x1f < (byte)c) || ((uVar2 < 0xe && ((0x2600U >> (uVar2 & 0x1f) & 1) != 0)))) {
        preprocessing(this,c);
        this->position = this->position + 1;
        if ((c == '\t') && (iVar1 = this->position, (iVar1 - 1U & 7) != 0)) {
          this->position = iVar1 + (-iVar1 & 7U) + 1;
        }
        goto LAB_00130ce7;
      }
    }
    error(this,E_InvalidControlCharacter,c);
    this->position = this->position + 1;
  }
LAB_00130ce7:
  this->afterCarriageReturn = c == '\r';
  return;
}

Assistant:

void CScanner::normalizeLineFeed( char c )
{
	if( c == CarriageReturn ) {
		preprocessing( LineFeed );
		line++;
		position = FirstCharacterNumber;
	} else if( c == LineFeed ) {
		if( !afterCarriageReturn ) {
			preprocessing( LineFeed );
			line++;
			position = FirstCharacterNumber;
		}
	} else if( IsControl( c ) ) {
		error( E_InvalidControlCharacter, c );
		position++;
	} else {
		preprocessing( c );
		position++;
		if( c == HorizontalTabulation ) {
			while( ( position - FirstCharacterNumber )
				% HorizontalTabulationSize != 0 )
			{
				position++;
			}
		}
	}
	afterCarriageReturn = ( c == CarriageReturn );
}